

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::changeRhs(SPxLPBase<double> *this,int i,double *newRhs,bool scale)

{
  double *pdVar1;
  undefined7 in_register_00000009;
  double extraout_XMM0_Qa;
  double dVar2;
  
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    dVar2 = *newRhs;
    ::soplex::infinity::__tls_init();
    pdVar1 = (double *)__tls_get_addr(&PTR_003b6b60);
    if (dVar2 < *pdVar1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x2e])(*newRhs,this->lp_scaler,this,i);
      dVar2 = extraout_XMM0_Qa;
      goto LAB_001e8e9b;
    }
  }
  dVar2 = *newRhs;
LAB_001e8e9b:
  (this->super_LPRowSetBase<double>).right.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start[i] = dVar2;
  return;
}

Assistant:

virtual void changeRhs(int i, const R& newRhs, bool scale = false)
   {
      if(scale && newRhs < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPRowSetBase<R>::rhs_w(i) = lp_scaler->scaleRhs(*this, i, newRhs);
      }
      else
         LPRowSetBase<R>::rhs_w(i) = newRhs;

      assert(isConsistent());
   }